

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

int deqp::gles3::Functional::computeTotalScalarSize
              (vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               *symbols)

{
  int iVar1;
  int iVar2;
  pointer pSVar3;
  
  iVar2 = 0;
  for (pSVar3 = (symbols->
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pSVar3 != (symbols->
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                )._M_impl.super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
    iVar1 = glu::VarType::getScalarSize(&pSVar3->varType);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

static int computeTotalScalarSize (const vector<Symbol>& symbols)
{
	int totalSize = 0;
	for (vector<Symbol>::const_iterator sym = symbols.begin(); sym != symbols.end(); ++sym)
		totalSize += sym->varType.getScalarSize();
	return totalSize;
}